

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall CTcSymFunc::gen_code(CTcSymFunc *this,int discard)

{
  int iVar1;
  int iVar2;
  CTcGenTarg *pCVar3;
  size_t in_RCX;
  char buf [4];
  undefined4 local_1c;
  
  CTcGenTarg::write_op(G_cg,'\v');
  CTcSymFuncBase::add_abs_fixup(&this->super_CTcSymFuncBase,&G_cs->super_CTcDataStream);
  local_1c = 0;
  CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_1c,(void *)0x4,in_RCX);
  pCVar3 = G_cg;
  iVar2 = G_cg->sp_depth_;
  iVar1 = iVar2 + 1;
  G_cg->sp_depth_ = iVar1;
  if (pCVar3->max_sp_depth_ <= iVar2) {
    pCVar3->max_sp_depth_ = iVar1;
  }
  return;
}

Assistant:

void CTcSymFunc::gen_code(int discard)
{
    /* 
     *   function address are always unknown during code generation;
     *   generate a placeholder instruction and add a fixup record for it 
     */
    G_cg->write_op(OPC_PUSHFNPTR);

    /* add a fixup for the current code location */
    add_abs_fixup(G_cs);

    /* write a placeholder offset - arbitrarily use zero */
    G_cs->write4(0);

    /* note the push */
    G_cg->note_push();
}